

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O3

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  mode_t mVar5;
  int iVar6;
  char *pcVar7;
  int64_t iVar8;
  char *pcVar9;
  int *piVar11;
  long lVar12;
  char *__path;
  void *__value;
  size_t size;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  archive_vtable_conflict *paVar17;
  long lVar18;
  size_t sVar19;
  stat s;
  int local_10e0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar10;
  
  archive_clear_error(_a);
  pcVar7 = archive_entry_sourcepath(entry);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = archive_entry_pathname(entry);
  }
  if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].magic + 1) == '\0') {
          st = &local_10c8;
          iVar2 = lstat(pcVar7,(stat *)st);
          if (iVar2 != 0) {
            piVar11 = __errno_location();
            iVar2 = *piVar11;
            pcVar9 = "Can\'t lstat %s";
            goto LAB_0015e8c5;
          }
        }
        else {
          st = &local_10c8;
          iVar2 = stat(pcVar7,(stat *)st);
          if (iVar2 != 0) {
            piVar11 = __errno_location();
            iVar2 = *piVar11;
            pcVar9 = "Can\'t stat %s";
LAB_0015e8c5:
            archive_set_error(_a,iVar2,pcVar9,pcVar7);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar11 = __errno_location();
          iVar2 = *piVar11;
          pcVar7 = "Can\'t fstat";
          goto LAB_0015e669;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  iVar8 = archive_entry_uid(entry);
  pcVar9 = archive_read_disk_uname(_a,iVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar9);
  }
  iVar8 = archive_entry_gid(entry);
  pcVar9 = archive_read_disk_gname(_a,iVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar9);
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar19 = st->st_size + 1;
    pcVar9 = (char *)malloc(sVar19);
    if (pcVar9 == (char *)0x0) {
      pcVar7 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_0015e669:
      archive_set_error(_a,iVar2,pcVar7);
      return -0x19;
    }
    if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
      sVar10 = readlink(pcVar7,pcVar9,sVar19);
      uVar3 = (uint)sVar10;
    }
    else {
      iVar2 = (*(code *)_a[1].archive_format_name)();
      sVar10 = readlinkat(iVar2,pcVar7,pcVar9,sVar19);
      uVar3 = (uint)sVar10;
    }
    if ((int)uVar3 < 0) {
      piVar11 = __errno_location();
      archive_set_error(_a,*piVar11,"Couldn\'t read link data");
      free(pcVar9);
      return -0x19;
    }
    pcVar9[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar9);
    free(pcVar9);
  }
  pcVar7 = archive_entry_sourcepath(entry);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = archive_entry_pathname(entry);
  }
  iVar2 = fd;
  if (fd < 0) {
    paVar17 = _a[1].vtable;
    if (paVar17 == (archive_vtable_conflict *)0x0) {
LAB_0015e802:
      if (*(char *)((long)&_a[1].magic + 1) == '\0') {
        sVar19 = llistxattr(pcVar7,(char *)0x0,0);
      }
      else {
        sVar19 = listxattr(pcVar7,(char *)0x0,0);
      }
      goto LAB_0015e6d6;
    }
    if (*(char *)((long)&_a[1].magic + 1) == '\0') {
      mVar5 = archive_entry_filetype(entry);
      if (mVar5 != 0xa000) {
        paVar17 = _a[1].vtable;
        goto LAB_0015e750;
      }
    }
    else {
LAB_0015e750:
      iVar2 = (**(code **)&_a[1].archive_format)(paVar17,pcVar7,0x800);
      if (-1 < iVar2) goto LAB_0015e6ca;
    }
    iVar4 = (**(code **)&_a[1].compression_code)(_a[1].vtable);
    if (iVar4 == 0) goto LAB_0015e802;
    piVar11 = __errno_location();
    archive_set_error(_a,*piVar11,"Couldn\'t access %s",pcVar7);
    local_10e0 = -0x19;
  }
  else {
LAB_0015e6ca:
    sVar19 = flistxattr(iVar2,(char *)0x0,0);
LAB_0015e6d6:
    local_10e0 = 0;
    if (sVar19 != 0) {
      if (sVar19 == 0xffffffffffffffff) {
        piVar11 = __errno_location();
        iVar4 = *piVar11;
        if ((iVar4 != 0x26) && (iVar4 != 0x5f)) {
          archive_set_error(_a,iVar4,"Couldn\'t list extended attributes");
LAB_0015eae9:
          local_10e0 = -0x14;
        }
      }
      else {
        pcVar9 = (char *)malloc(sVar19);
        if (pcVar9 == (char *)0x0) {
          piVar11 = __errno_location();
          archive_set_error(_a,*piVar11,"Out of memory");
          local_10e0 = -0x1e;
        }
        else {
          if (iVar2 < 0) {
            if (*(char *)((long)&_a[1].magic + 1) == '\0') {
              lVar12 = llistxattr(pcVar7,pcVar9,sVar19);
            }
            else {
              lVar12 = listxattr(pcVar7,pcVar9,sVar19);
            }
          }
          else {
            lVar12 = flistxattr(iVar2,pcVar9,sVar19);
          }
          if (lVar12 == -1) {
            piVar11 = __errno_location();
            archive_set_error(_a,*piVar11,"Couldn\'t retrieve extended attributes");
            free(pcVar9);
            goto LAB_0015eae9;
          }
          pcVar7 = pcVar9;
          if (0 < lVar12) {
            do {
              iVar4 = strncmp(pcVar7,"system.",7);
              if ((iVar4 != 0) && (iVar4 = strncmp(pcVar7,"xfsroot.",8), iVar4 != 0)) {
                __path = archive_entry_sourcepath(entry);
                if (__path == (char *)0x0) {
                  __path = archive_entry_pathname(entry);
                }
                if (iVar2 < 0) {
                  if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                    sVar19 = lgetxattr(__path,pcVar7,(void *)0x0,0);
                  }
                  else {
                    sVar19 = getxattr(__path,pcVar7,(void *)0x0,0);
                  }
                }
                else {
                  sVar19 = fgetxattr(iVar2,pcVar7,(void *)0x0,0);
                }
                if (sVar19 == 0xffffffffffffffff) {
                  piVar11 = __errno_location();
                  archive_set_error(_a,*piVar11,"Couldn\'t query extended attribute");
                }
                else {
                  if ((long)sVar19 < 1) {
                    __value = (void *)0x0;
                  }
                  else {
                    __value = malloc(sVar19);
                    if (__value == (void *)0x0) {
                      piVar11 = __errno_location();
                      archive_set_error(_a,*piVar11,"Out of memory");
                      goto LAB_0015ea99;
                    }
                  }
                  if (iVar2 < 0) {
                    if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                      size = lgetxattr(__path,pcVar7,__value,sVar19);
                    }
                    else {
                      size = getxattr(__path,pcVar7,__value,sVar19);
                    }
                  }
                  else {
                    size = fgetxattr(iVar2,pcVar7,__value,sVar19);
                  }
                  if (size == 0xffffffffffffffff) {
                    piVar11 = __errno_location();
                    archive_set_error(_a,*piVar11,"Couldn\'t read extended attribute");
                  }
                  else {
                    archive_entry_xattr_add_entry(entry,pcVar7,__value,size);
                    free(__value);
                  }
                }
              }
LAB_0015ea99:
              sVar19 = strlen(pcVar7);
              pcVar7 = pcVar7 + sVar19 + 1;
            } while ((long)pcVar7 - (long)pcVar9 < lVar12);
          }
          free(pcVar9);
        }
      }
    }
  }
  mVar5 = archive_entry_filetype(entry);
  iVar4 = 0;
  if (((mVar5 == 0x8000) && (iVar8 = archive_entry_size(entry), iVar4 = 0, 0 < iVar8)) &&
     (pcVar7 = archive_entry_hardlink(entry), iVar4 = 0, pcVar7 == (char *)0x0)) {
    if (iVar2 < 0) {
      pcVar7 = archive_entry_sourcepath(entry);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = archive_entry_pathname(entry);
      }
      if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
        iVar2 = open(pcVar7,0x80800);
      }
      else {
        iVar2 = (**(code **)&_a[1].archive_format)(_a[1].vtable,pcVar7,0x80800);
      }
      if (iVar2 < 0) {
        piVar11 = __errno_location();
        archive_set_error(_a,*piVar11,"Can\'t open `%s\'",pcVar7);
        iVar4 = -0x19;
        goto LAB_0015eb1d;
      }
      __archive_ensure_cloexec_flag(iVar2);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar13 = archive_entry_size(entry);
    iVar6 = ioctl(iVar2,0xc020660b,local_1038);
    iVar4 = 0;
    if ((-1 < iVar6) && (local_1024 != 0)) {
      do {
        uVar3 = local_1024;
        if (0 < (int)local_1024) {
          bVar1 = true;
          iVar6 = 0;
          puVar16 = local_ff0;
          do {
            uVar14 = *puVar16;
            if ((uVar14 >> 0xb & 1) == 0) {
              lVar12 = *(long *)(puVar16 + -10);
              uVar15 = lVar12 + *(long *)(puVar16 + -6);
              lVar18 = 0;
              if (uVar13 <= uVar15) {
                lVar18 = uVar15 - uVar13;
              }
              uVar15 = *(long *)(puVar16 + -6) - lVar18;
              iVar4 = 0;
              if (uVar15 == uVar13 && lVar12 == 0) goto LAB_0015eb1d;
              if (0 < (long)uVar15) {
                archive_entry_sparse_add_entry(entry,lVar12,uVar15);
                uVar14 = *puVar16;
                uVar3 = local_1024;
              }
            }
            if ((uVar14 & 1) != 0) {
              bVar1 = false;
            }
            iVar6 = iVar6 + 1;
            puVar16 = puVar16 + 0xe;
          } while (iVar6 < (int)uVar3);
          if (!bVar1) {
            iVar4 = 0;
            break;
          }
        }
        local_1038[0] =
             local_1038[(ulong)uVar3 * 7 + -1] + local_10c8.__glibc_reserved[(ulong)uVar3 * 7];
        iVar6 = ioctl(iVar2,0xc020660b,local_1038);
        iVar4 = 0;
        if ((iVar6 < 0) || (iVar4 = 0, local_1024 == 0)) break;
      } while( true );
    }
  }
LAB_0015eb1d:
  if (iVar4 < local_10e0) {
    local_10e0 = iVar4;
  }
  if (iVar2 != fd) {
    close(iVar2);
  }
  return local_10e0;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	r1 = setup_xattrs(a, entry, &fd);
	if (r1 < r)
		r = r1;
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}